

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThreeAction.cpp
# Opt level: O2

ActionResults * __thiscall BlueRoomThreeAction::Look(BlueRoomThreeAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  string *this_00;
  allocator local_51;
  string local_50;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == PIPE) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_30,
               "The pipes appear to be some complex, interconnected mechanism, each about 3 inches in diameter."
               ,&local_51);
    ActionResults::ActionResults(pAVar2,CURRENT,&local_30);
    this_00 = &local_30;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != BALL) {
      pAVar2 = AbstractRoomAction::Look(&this->super_AbstractRoomAction);
      return pAVar2;
    }
    pAVar2 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_50,
               "The ball is between 2 to 3 inches in diameter. Looks like it might fit through those pipes."
               ,&local_51);
    ActionResults::ActionResults(pAVar2,CURRENT,&local_50);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
  return pAVar2;
}

Assistant:

ActionResults * BlueRoomThreeAction::Look() {
    if (commands->getMainItem() == PIPE) {
        return new ActionResults(CURRENT, "The pipes appear to be some complex, interconnected mechanism, each about 3 inches in diameter.");
    } else if(commands->getMainItem() == BALL){
        return new ActionResults(CURRENT, "The ball is between 2 to 3 inches in diameter. Looks like it might fit through those pipes.");
    } else {
        return AbstractRoomAction::Look();
    }
}